

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void slang::ast::UninstantiatedDefSymbol::fromSyntax
               (Compilation *compilation,PrimitiveInstantiationSyntax *syntax,
               HierarchicalInstanceSyntax *specificInstance,ASTContext *parentContext,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *implicitNetNames)

{
  size_t sVar1;
  NetType *netType;
  HierarchicalInstanceSyntax *instanceSyntax;
  string_view sVar2;
  const_iterator __begin3;
  ASTContext context;
  
  ASTContext::resetFlags(&context,parentContext,(bitmask<slang::ast::ASTFlags>)0x20);
  netType = Scope::getDefaultNetType(context.scope.ptr);
  if (specificInstance == (HierarchicalInstanceSyntax *)0x0) {
    __begin3.index = 0;
    sVar1 = (syntax->instances).elements._M_extent._M_extent_value;
    __begin3.list = &syntax->instances;
    for (; (__begin3.list != &syntax->instances || (__begin3.index != sVar1 + 1 >> 1));
        __begin3.index = __begin3.index + 1) {
      instanceSyntax =
           slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
           iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>::dereference(&__begin3);
      sVar2 = parsing::Token::valueText(&syntax->type);
      createUninstantiatedDef<slang::syntax::PrimitiveInstantiationSyntax>
                (compilation,syntax,instanceSyntax,sVar2,&context,
                 (span<const_slang::ast::Expression_*const,_18446744073709551615UL>)ZEXT816(0),
                 results,implicitNets,implicitNetNames,netType);
    }
  }
  else {
    sVar2 = parsing::Token::valueText(&syntax->type);
    createUninstantiatedDef<slang::syntax::PrimitiveInstantiationSyntax>
              (compilation,syntax,specificInstance,sVar2,&context,
               (span<const_slang::ast::Expression_*const,_18446744073709551615UL>)ZEXT816(0),results
               ,implicitNets,implicitNetNames,netType);
  }
  return;
}

Assistant:

void UninstantiatedDefSymbol::fromSyntax(Compilation& compilation,
                                         const PrimitiveInstantiationSyntax& syntax,
                                         const syntax::HierarchicalInstanceSyntax* specificInstance,
                                         const ASTContext& parentContext,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets,
                                         SmallSet<std::string_view, 8>& implicitNetNames) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto& netType = context.scope->getDefaultNetType();

    if (specificInstance) {
        createUninstantiatedDef(compilation, syntax, specificInstance, syntax.type.valueText(),
                                context, {}, results, implicitNets, implicitNetNames, netType);
    }
    else {
        for (auto instanceSyntax : syntax.instances) {
            createUninstantiatedDef(compilation, syntax, instanceSyntax, syntax.type.valueText(),
                                    context, {}, results, implicitNets, implicitNetNames, netType);
        }
    }
}